

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::CovergroupDeclarationSyntax::setChild
          (CovergroupDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  FunctionPortListSyntax *pFVar3;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar4;
  SyntaxNode *pSVar5;
  NamedBlockClauseSyntax *pNVar6;
  logic_error *this_00;
  Token TVar7;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 9) {
    switch(index) {
    case 0:
      pSVar5 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar5);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->covergroup).kind = TVar7.kind;
      (this->covergroup).field_0x2 = TVar7._2_1_;
      (this->covergroup).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->covergroup).rawLen = TVar7.rawLen;
      (this->covergroup).info = TVar7.info;
      break;
    case 2:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->name).kind = TVar7.kind;
      (this->name).field_0x2 = TVar7._2_1_;
      (this->name).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->name).rawLen = TVar7.rawLen;
      (this->name).info = TVar7.info;
      break;
    case 3:
      pSVar5 = TokenOrSyntax::node(&child);
      if (pSVar5 == (SyntaxNode *)0x0) {
        pFVar3 = (FunctionPortListSyntax *)0x0;
      }
      else {
        pSVar5 = TokenOrSyntax::node(&child);
        pFVar3 = SyntaxNode::as<slang::syntax::FunctionPortListSyntax>(pSVar5);
      }
      this->portList = pFVar3;
      break;
    case 4:
      pSVar5 = TokenOrSyntax::node(&child);
      if (pSVar5 == (SyntaxNode *)0x0) {
        pSVar5 = (SyntaxNode *)0x0;
      }
      else {
        pSVar5 = TokenOrSyntax::node(&child);
      }
      this->event = pSVar5;
      break;
    case 5:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi).kind = TVar7.kind;
      (this->semi).field_0x2 = TVar7._2_1_;
      (this->semi).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->semi).rawLen = TVar7.rawLen;
      (this->semi).info = TVar7.info;
      break;
    case 6:
      pSVar5 = TokenOrSyntax::node(&child);
      pSVar4 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(pSVar5);
      (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->members).super_SyntaxListBase.childCount = (pSVar4->super_SyntaxListBase).childCount;
      sVar1 = (pSVar4->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
      (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar4->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
      (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ =
           sVar1;
      break;
    case 7:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->endgroup).kind = TVar7.kind;
      (this->endgroup).field_0x2 = TVar7._2_1_;
      (this->endgroup).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->endgroup).rawLen = TVar7.rawLen;
      (this->endgroup).info = TVar7.info;
      break;
    case 8:
      pSVar5 = TokenOrSyntax::node(&child);
      if (pSVar5 == (SyntaxNode *)0x0) {
        pNVar6 = (NamedBlockClauseSyntax *)0x0;
      }
      else {
        pSVar5 = TokenOrSyntax::node(&child);
        pNVar6 = SyntaxNode::as<slang::syntax::NamedBlockClauseSyntax>(pSVar5);
      }
      this->endBlockName = pNVar6;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0xd80);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void CovergroupDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: covergroup = child.token(); return;
        case 2: name = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<FunctionPortListSyntax>() : nullptr; return;
        case 4: event = child.node() ? &child.node()->as<SyntaxNode>() : nullptr; return;
        case 5: semi = child.token(); return;
        case 6: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 7: endgroup = child.token(); return;
        case 8: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}